

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FANSFrequencysatchannel.c
# Opt level: O1

int FANSFrequencysatchannel_constraint
              (asn_TYPE_descriptor_t *td,void *sptr,asn_app_constraint_failed_f *ctfailcb,
              void *app_key)

{
  byte bVar1;
  byte *pbVar2;
  char *pcVar3;
  byte *pbVar4;
  char *pcVar5;
  undefined4 uVar6;
  
  if (sptr == (void *)0x0) {
    if (ctfailcb == (asn_app_constraint_failed_f *)0x0) {
      return -1;
    }
    pcVar5 = td->name;
    uVar6 = 0x2b;
    pcVar3 = "%s: value not given (%s:%d)";
    sptr = (void *)0x0;
  }
  else {
    if (*(int *)((long)sptr + 8) == 0xc) {
      pbVar2 = *sptr;
      do {
        pbVar4 = pbVar2 + 1;
        bVar1 = *pbVar2;
        if (permitted_alphabet_table_1[bVar1] == 0) break;
        pbVar2 = pbVar4;
      } while (pbVar4 < *sptr + 0xc);
      if (permitted_alphabet_table_1[bVar1] != 0) {
        return 0;
      }
    }
    if (ctfailcb == (asn_app_constraint_failed_f *)0x0) {
      return -1;
    }
    pcVar5 = td->name;
    uVar6 = 0x38;
    pcVar3 = "%s: constraint failed (%s:%d)";
  }
  (*ctfailcb)(app_key,td,sptr,pcVar3,pcVar5,
              "/workspace/llm4binary/github/license_c_cmakelists/szpajder[P]libacars/libacars/asn1/FANSFrequencysatchannel.c"
              ,uVar6);
  return -1;
}

Assistant:

int
FANSFrequencysatchannel_constraint(asn_TYPE_descriptor_t *td, const void *sptr,
			asn_app_constraint_failed_f *ctfailcb, void *app_key) {
	const NumericString_t *st = (const NumericString_t *)sptr;
	size_t size;
	
	if(!sptr) {
		ASN__CTFAIL(app_key, td, sptr,
			"%s: value not given (%s:%d)",
			td->name, __FILE__, __LINE__);
		return -1;
	}
	
	size = st->size;
	
	if((size == 12)
		 && !check_permitted_alphabet_1(st)) {
		/* Constraint check succeeded */
		return 0;
	} else {
		ASN__CTFAIL(app_key, td, sptr,
			"%s: constraint failed (%s:%d)",
			td->name, __FILE__, __LINE__);
		return -1;
	}
}